

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int weapon_hit_bonus(obj *weapon)

{
  int iVar1;
  int local_3c;
  int local_24;
  int local_20;
  uint local_1c;
  int bonus;
  int skill;
  int wep_type;
  int type;
  obj *weapon_local;
  
  local_20 = 0;
  iVar1 = weapon_type(weapon);
  local_24 = iVar1;
  if ((u.twoweap != '\0') && ((weapon == uwep || (weapon == uswapwep)))) {
    local_24 = 0x26;
  }
  if (local_24 == 0) {
    local_20 = 0;
  }
  else if (local_24 < 0x1e) {
    switch(u.weapon_skills[local_24].skill) {
    case '\x02':
      local_20 = 0;
      break;
    case '\x03':
      local_20 = 2;
      break;
    case '\x04':
      local_20 = 5;
      break;
    default:
      impossible("weapon_hit_bonus: bad skill %d",(ulong)(uint)(int)u.weapon_skills[local_24].skill)
      ;
    case '\0':
    case '\x01':
      local_20 = -4;
    }
  }
  else if (local_24 == 0x26) {
    local_1c = (uint)u.weapon_skills[0x26].skill;
    if ((int)u.weapon_skills[iVar1].skill < (int)local_1c) {
      local_1c = (uint)u.weapon_skills[iVar1].skill;
    }
    switch(local_1c) {
    case 2:
      local_20 = -7;
      break;
    case 3:
      local_20 = -5;
      break;
    case 4:
      local_20 = -2;
      break;
    default:
      impossible("weapon_hit_bonus: bad skill %d",(ulong)local_1c);
    case 0:
    case 1:
      local_20 = -9;
    }
  }
  else if (local_24 == 0x25) {
    local_3c = (int)u.weapon_skills[0x25].skill;
    if (local_3c < 2) {
      local_3c = 1;
    }
    iVar1 = 1;
    if (urole.malenum == 0x165 || urole.malenum == 0x160) {
      iVar1 = 2;
    }
    local_20 = ((local_3c + 1) * iVar1) / 2;
  }
  if (u.usteed != (monst *)0x0) {
    switch(u.weapon_skills[0x27].skill) {
    case '\0':
    case '\x01':
      local_20 = local_20 + -2;
      break;
    case '\x02':
      local_20 = local_20 + -1;
      break;
    case '\x03':
      break;
    case '\x04':
      local_20 = local_20 + 2;
    }
    if (u.twoweap != '\0') {
      local_20 = local_20 + -2;
    }
  }
  return local_20;
}

Assistant:

int weapon_hit_bonus(struct obj *weapon)
{
    int type, wep_type, skill, bonus = 0;
    static const char bad_skill[] = "weapon_hit_bonus: bad skill %d";

    wep_type = weapon_type(weapon);
    /* use two weapon skill only if attacking with one of the wielded weapons */
    type = (u.twoweap && (weapon == uwep || weapon == uswapwep)) ?
	    P_TWO_WEAPON_COMBAT : wep_type;
    if (type == P_NONE) {
	bonus = 0;
    } else if (type <= P_LAST_WEAPON) {
	switch (P_SKILL(type)) {
	    default: impossible(bad_skill, P_SKILL(type)); /* fall through */
	    case P_ISRESTRICTED:
	    case P_UNSKILLED:   bonus = -4; break;
	    case P_BASIC:       bonus =  0; break;
	    case P_SKILLED:     bonus =  2; break;
	    case P_EXPERT:      bonus =  5; break;
	}
    } else if (type == P_TWO_WEAPON_COMBAT) {
	skill = P_SKILL(P_TWO_WEAPON_COMBAT);
	if (P_SKILL(wep_type) < skill) skill = P_SKILL(wep_type);
	switch (skill) {
	    default: impossible(bad_skill, skill); /* fall through */
	    case P_ISRESTRICTED:
	    case P_UNSKILLED:   bonus = -9; break;
	    case P_BASIC:	bonus = -7; break;
	    case P_SKILLED:	bonus = -5; break;
	    case P_EXPERT:	bonus = -2; break;
	}
    } else if (type == P_BARE_HANDED_COMBAT) {
	/*
	 *	       b.h.  m.a.
	 *	unskl:	+1   n/a
	 *	basic:	+1    +3
	 *	skild:	+2    +4
	 *	exprt:	+2    +5
	 *	mastr:	+3    +6
	 *	grand:	+3    +7
	 */
	bonus = P_SKILL(type);
	bonus = max(bonus,P_UNSKILLED) - 1;	/* unskilled => 0 */
	bonus = ((bonus + 2) * (martial_bonus() ? 2 : 1)) / 2;
    }

	/* KMH -- It's harder to hit while you are riding */
	if (u.usteed) {
		switch (P_SKILL(P_RIDING)) {
		    case P_ISRESTRICTED:
		    case P_UNSKILLED:   bonus -= 2; break;
		    case P_BASIC:       bonus -= 1; break;
		    case P_SKILLED:     break;
		    /* but an expert can use the added momentum */
		    case P_EXPERT:      bonus += 2; break;
		}
		if (u.twoweap) bonus -= 2;
	}

    return bonus;
}